

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O2

deUint32 glu::chooseColorFormat(RenderConfig *config)

{
  deUint32 internalFormat;
  long lVar1;
  IVec4 bits;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  TextureFormat local_38;
  
  lVar1 = 0;
  do {
    if (lVar1 == 0x20) {
      return 0;
    }
    internalFormat = *(deUint32 *)((long)chooseColorFormat::s_formats + lVar1);
    local_38 = mapGLInternalFormat(internalFormat);
    tcu::getTextureFormatBitDepth((tcu *)&local_48,&local_38);
    if ((((config->redBits == -1) || (config->redBits == local_48)) &&
        ((config->greenBits == -1 || (config->greenBits == local_44)))) &&
       ((config->blueBits == -1 || (config->blueBits == local_40)))) {
      if (config->alphaBits == -1) {
        return internalFormat;
      }
      if (config->alphaBits == local_3c) {
        return internalFormat;
      }
    }
    lVar1 = lVar1 + 4;
  } while( true );
}

Assistant:

deUint32 chooseColorFormat (const glu::RenderConfig& config)
{
	static const deUint32 s_formats[] =
	{
		GL_RGBA8,
		GL_RGB8,
		GL_RG8,
		GL_R8,
		GL_RGBA4,
		GL_RGB5_A1,
		GL_RGB565,
		GL_RGB5
	};

	for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(s_formats); fmtNdx++)
	{
		const deUint32		format	= s_formats[fmtNdx];
		const tcu::IVec4	bits	= tcu::getTextureFormatBitDepth(glu::mapGLInternalFormat(format));

		if (config.redBits != glu::RenderConfig::DONT_CARE &&
			config.redBits != bits[0])
			continue;

		if (config.greenBits != glu::RenderConfig::DONT_CARE &&
			config.greenBits != bits[1])
			continue;

		if (config.blueBits != glu::RenderConfig::DONT_CARE &&
			config.blueBits != bits[2])
			continue;

		if (config.alphaBits != glu::RenderConfig::DONT_CARE &&
			config.alphaBits != bits[3])
			continue;

		return format;
	}

	return 0;
}